

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaptureSummary.cpp
# Opt level: O1

uint64_t __thiscall
CaptureSummary::GetCountByNumber(CaptureSummary *this,char *table_name,uint32_t number)

{
  char cVar1;
  pointer pp_Var2;
  _capture_line *p_Var3;
  char cVar4;
  long lVar5;
  long lVar6;
  char cVar7;
  long lVar8;
  
  pp_Var2 = (this->summary).super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->summary).
                super__Vector_base<_capture_line_*,_std::allocator<_capture_line_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pp_Var2;
  if (lVar5 == 0) {
    return 0;
  }
  lVar5 = lVar5 >> 3;
  cVar1 = *table_name;
  lVar6 = 0;
  do {
    p_Var3 = pp_Var2[lVar6];
    cVar7 = p_Var3->registry_name[0];
    cVar4 = cVar1;
    if ((cVar1 != '\0') && (cVar1 == cVar7)) {
      lVar8 = 1;
      do {
        cVar4 = table_name[lVar8];
        cVar7 = p_Var3->registry_name[lVar8];
        if (cVar4 == '\0') break;
        lVar8 = lVar8 + 1;
      } while (cVar4 == cVar7);
    }
    if (((cVar4 == cVar7) && (p_Var3->key_type == 0)) && ((p_Var3->field_2).key_number == number)) {
      return p_Var3->count;
    }
    lVar6 = lVar6 + 1;
    if (lVar6 == lVar5 + (ulong)(lVar5 == 0)) {
      return 0;
    }
  } while( true );
}

Assistant:

uint64_t CaptureSummary::GetCountByNumber(char const * table_name, uint32_t number)
{
    uint64_t count = 0;

    for (size_t i = 0; i < summary.size(); i++)
    {
        if (compare_string(table_name, summary[i]->registry_name) == 0 &&
            summary[i]->key_type == 0 &&
            summary[i]->key_number == (int)number)
        {
            count = summary[i]->count;
            break;
        }
    }

    return count;
}